

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::TableScanCardinality(duckdb *this,ClientContext *context,FunctionData *bind_data_p)

{
  _func_int **pp_Var1;
  LocalStorage *this_00;
  DataTable *pDVar2;
  idx_t iVar3;
  idx_t iVar4;
  undefined1 *puVar5;
  
  pp_Var1 = bind_data_p[4]._vptr_FunctionData;
  this_00 = LocalStorage::Get(context,(Catalog *)pp_Var1[0x1b]);
  pDVar2 = (DataTable *)(**(code **)(*pp_Var1 + 0x80))(pp_Var1);
  iVar3 = DataTable::GetTotalRows(pDVar2);
  pDVar2 = (DataTable *)(**(code **)(*pp_Var1 + 0x80))(pp_Var1);
  iVar4 = LocalStorage::AddedRows(this_00,pDVar2);
  puVar5 = (undefined1 *)operator_new(0x20);
  *puVar5 = 1;
  *(idx_t *)(puVar5 + 8) = iVar3;
  puVar5[0x10] = 1;
  *(idx_t *)(puVar5 + 0x18) = iVar4 + iVar3;
  *(undefined1 **)this = puVar5;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> TableScanCardinality(ClientContext &context, const FunctionData *bind_data_p) {
	auto &bind_data = bind_data_p->Cast<TableScanBindData>();
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	auto &local_storage = LocalStorage::Get(context, duck_table.catalog);
	auto &storage = duck_table.GetStorage();
	idx_t table_rows = storage.GetTotalRows();
	idx_t estimated_cardinality = table_rows + local_storage.AddedRows(duck_table.GetStorage());
	return make_uniq<NodeStatistics>(table_rows, estimated_cardinality);
}